

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

ArgString * __thiscall
Potassco::ArgString::get<Clasp::RestartSchedule>(ArgString *this,RestartSchedule *x)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  KV *pKVar4;
  undefined8 in_RCX;
  Keep keep;
  AvgType slow;
  AvgType fast;
  bool bVar5;
  ScheduleStrategy SVar6;
  char *next;
  uint32 sWin;
  uint32 lim;
  pair<unsigned_int,_double> req;
  char *local_70;
  char *local_68;
  uint local_60;
  uint local_5c;
  pair<unsigned_int,_double> local_58;
  char *local_48;
  Span<Potassco::KV> local_40;
  
  pcVar2 = this->in;
  if (pcVar2 == (char *)0x0) {
    return this;
  }
  cVar1 = *pcVar2;
  bVar5 = cVar1 == this->skip;
  local_70 = pcVar2 + bVar5;
  local_68 = local_70;
  if ((byte)(pcVar2[bVar5] | 0x20U) != 100) {
    iVar3 = Clasp::xconvert(local_70,&x->super_ScheduleStrategy,&local_68,
                            (int)CONCAT71((int7)((ulong)in_RCX >> 8),cVar1));
    goto LAB_0012b238;
  }
  local_58.first = 0;
  local_58.second = 0.0;
  local_5c = 0;
  local_60 = 0;
  local_48 = (char *)0x0;
  if ((((local_70[1] == ',') &&
       (iVar3 = xconvert<unsigned_int,double>(local_70 + 2,&local_58,&local_70,0), iVar3 != 0)) &&
      (local_58.first != 0)) &&
     ((0.0 < local_58.second &&
      ((*local_70 != ',' ||
       (iVar3 = Potassco::xconvert(local_70 + 1,&local_5c,&local_70,0), iVar3 != 0)))))) {
    fast = avg_sma;
    if (*local_70 == ',') {
      local_40.first = (KV *)Clasp::enumMap(Clasp::MovingAvg::Type_const*)::map;
      local_40.size = 5;
      pKVar4 = findValue(&local_40,local_70 + 1,&local_70,",");
      if (pKVar4 != (KV *)0x0) {
        fast = pKVar4->value;
        goto LAB_0012b124;
      }
LAB_0012b25f:
      local_68 = local_70;
      iVar3 = 0;
      goto LAB_0012b238;
    }
LAB_0012b124:
    keep = keep_never;
    if ((*local_70 == ',') && (keep = keep_never, fast != avg_sma)) {
      local_40.first = (KV *)Clasp::enumMap(Clasp::RestartSchedule::Keep_const*)::map;
      local_40.size = 5;
      pKVar4 = findValue(&local_40,local_70 + 1,&local_48,",");
      if (pKVar4 == (KV *)0x0) {
        keep = keep_never;
      }
      else {
        keep = pKVar4->value;
        local_70 = local_48;
      }
    }
    slow = avg_sma;
    if (*local_70 == ',') {
      local_40.first = (KV *)Clasp::enumMap(Clasp::MovingAvg::Type_const*)::map;
      local_40.size = 5;
      pKVar4 = findValue(&local_40,local_70 + 1,&local_70,",");
      if (pKVar4 == (KV *)0x0) goto LAB_0012b25f;
      slow = pKVar4->value;
    }
    if (((*local_70 != ',') || (slow == avg_sma)) ||
       (iVar3 = Potassco::xconvert(local_70 + 1,&local_60,&local_70,0), iVar3 != 0)) {
      SVar6 = (ScheduleStrategy)
              Clasp::RestartSchedule::dynamic
                        (local_58.first,(float)local_58.second,local_5c,fast,keep,slow,local_60);
      x->super_ScheduleStrategy = SVar6;
      local_68 = local_70;
      iVar3 = 1;
      goto LAB_0012b238;
    }
  }
  iVar3 = 0;
  local_68 = local_70;
LAB_0012b238:
  if (iVar3 == 0) {
    local_68 = (char *)0x0;
  }
  this->in = local_68;
  this->skip = ',';
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}